

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host-gl.c
# Opt level: O2

Result host_gl_program(GLuint vert_shader,GLuint frag_shader,GLuint *out_program)

{
  GLuint GVar1;
  undefined8 in_RAX;
  GLchar *pGVar2;
  bool bVar3;
  GLint length;
  GLint status;
  
  _length = in_RAX;
  GVar1 = (*glCreateProgram)();
  (*glAttachShader)(GVar1,vert_shader);
  (*glAttachShader)(GVar1,frag_shader);
  (*glLinkProgram)(GVar1);
  (*glGetProgramiv)(GVar1,0x8b82,&status);
  bVar3 = status == 0;
  if (bVar3) {
    (*glGetProgramiv)(GVar1,0x8b84,&length);
    pGVar2 = (GLchar *)malloc((long)length + 1);
    (*glGetProgramInfoLog)(GVar1,length,(GLsizei *)0x0,pGVar2);
    fprintf(_stderr,"%s ERROR: %s\n","GL_PROGRAM",pGVar2);
  }
  else {
    *out_program = GVar1;
  }
  return (uint)bVar3;
}

Assistant:

Result host_gl_program(GLuint vert_shader, GLuint frag_shader,
                       GLuint* out_program) {
  GLuint program = glCreateProgram();
  glAttachShader(program, vert_shader);
  glAttachShader(program, frag_shader);
  glLinkProgram(program);
  CHECK_LOG(program, Program, GL_LINK_STATUS, "GL_PROGRAM");
  *out_program = program;
  return OK;
  ON_ERROR_RETURN;
}